

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall fmt::v7::detail::bigint::align(bigint *this,bigint *other)

{
  int iVar1;
  ulong uVar2;
  uint *puVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar9 = this->exp_ - other->exp_;
  if (uVar9 != 0 && other->exp_ <= this->exp_) {
    iVar1 = (int)(this->bigits_).super_buffer<unsigned_int>.size_;
    if ((int)(uVar9 + iVar1) < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    uVar8 = (ulong)(uVar9 + iVar1);
    if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar8) {
      (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
    }
    uVar2 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
    if (uVar2 < uVar8) {
      uVar8 = uVar2;
    }
    (this->bigits_).super_buffer<unsigned_int>.size_ = uVar8;
    if (0 < iVar1) {
      puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      lVar7 = (long)(int)(iVar1 + uVar9 + -1);
      lVar5 = (ulong)(iVar1 - 1) + 1;
      do {
        puVar3[lVar7] = puVar3[lVar5 + -1];
        lVar7 = lVar7 + -1;
        lVar6 = lVar5 + -1;
        bVar4 = 0 < lVar5;
        lVar5 = lVar6;
      } while (lVar6 != 0 && bVar4);
    }
    memset((this->bigits_).super_buffer<unsigned_int>.ptr_,0,(ulong)uVar9 << 2);
    this->exp_ = this->exp_ - uVar9;
  }
  return;
}

Assistant:

void align(const bigint& other) {
    int exp_difference = exp_ - other.exp_;
    if (exp_difference <= 0) return;
    int num_bigits = static_cast<int>(bigits_.size());
    bigits_.resize(to_unsigned(num_bigits + exp_difference));
    for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
      bigits_[j] = bigits_[i];
    std::uninitialized_fill_n(bigits_.data(), exp_difference, 0);
    exp_ -= exp_difference;
  }